

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzDivW(word *q,word *a,size_t n,word w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  long lVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  dword divisor;
  word r;
  undefined8 local_28;
  undefined8 local_18;
  
  local_28 = 0;
  local_18 = in_RDX;
  while (lVar3 = local_18 + -1, local_18 != 0) {
    uVar1 = *(undefined8 *)(in_RSI + lVar3 * 8);
    uVar2 = __udivti3(uVar1,local_28,in_RCX);
    *(undefined8 *)(in_RDI + lVar3 * 8) = uVar2;
    local_28 = __umodti3(uVar1,local_28,in_RCX,0);
    local_18 = lVar3;
  }
  return local_28;
}

Assistant:

word zzDivW(word q[], const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsSameOrDisjoint(a, q, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		q[n] = (word)(divisor / w);
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}